

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

reference __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator*
          (span_iterator<pstore::gsl::span<int,__1L>,_false> *this)

{
  reference peVar1;
  span_iterator<pstore::gsl::span<int,__1L>,_false> *this_local;
  
  if (this->span_ != (span<int,__1L> *)0x0) {
    peVar1 = span<int,_-1L>::operator[](this->span_,this->index_);
    return peVar1;
  }
  assert_failed("span_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x6f);
}

Assistant:

reference operator* () const {
                    PSTORE_ASSERT (span_);
                    return (*span_)[index_];
                }